

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O3

base_learner * multilabel_oaa_setup(options_i *options,vw *all)

{
  int iVar1;
  multi_oaa *dat;
  base_learner *l;
  single_learner *base;
  learner<multi_oaa,_example> *plVar2;
  long lVar3;
  undefined **ppuVar4;
  label_parser *plVar5;
  byte bVar6;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_210;
  _func_int **local_208;
  _func_int **local_200 [2];
  long local_1f0;
  option_group_definition local_1e8;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  string local_190;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<unsigned_long> local_d0;
  
  bVar6 = 0;
  dat = calloc_or_throw<multi_oaa>(1);
  dat->k = 0;
  local_170._0_8_ = (_func_int **)0x1a;
  local_210 = local_200;
  local_210 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_210,(ulong)local_170);
  local_200[0] = (_func_int **)local_170._0_8_;
  builtin_strncpy((char *)((long)local_210 + 10)," One Aga",8);
  builtin_strncpy((char *)((long)local_210 + 0x12),"inst All",8);
  *(undefined4 *)local_210 = 0x746c754d;
  builtin_strncpy((char *)((long)local_210 + 4),"ilab",4);
  *(undefined4 *)(local_210 + 1) = 0x4f206c65;
  builtin_strncpy((char *)((long)local_210 + 0xc),"ne A",4);
  local_208 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_210 + local_170._0_8_) = '\0';
  local_1e8.m_name._M_dataplus._M_p = (pointer)&local_1e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_210,(char *)(local_170._0_8_ + (long)local_210));
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  local_190.field_2._M_allocated_capacity._0_6_ = 0x6c69746c756d;
  local_190.field_2._M_allocated_capacity._6_2_ = 0x6261;
  local_190.field_2._8_6_ = 0x61616f5f6c65;
  local_190._M_string_length = 0xe;
  local_190.field_2._M_local_buf[0xe] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_170,&local_190,&dat->k);
  local_100 = true;
  local_1f0 = 0x2a;
  local_1b0 = local_1a0;
  local_1b0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1b0,(ulong)&local_1f0);
  local_1a0[0] = local_1f0;
  builtin_strncpy((char *)((long)local_1b0 + 0x1a)," with <k",8);
  builtin_strncpy((char *)((long)local_1b0 + 0x22),"> labels",8);
  local_1b0[2] = 0x62616c69746c756d;
  local_1b0[3] = 0x2068746977206c65;
  *local_1b0 = 0x696167612d656e4f;
  local_1b0[1] = 0x206c6c612d74736e;
  local_1a8 = local_1f0;
  *(char *)((long)local_1b0 + local_1f0) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_170);
  VW::config::option_group_definition::add<unsigned_long>(&local_1e8,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd190;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  local_170._0_8_ = &PTR__typed_option_002cd190;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1e8);
  local_170._16_6_ = 0x6c69746c756d;
  local_170._22_2_ = 0x6261;
  local_170._24_6_ = 0x61616f5f6c65;
  local_170._8_8_ = (pointer)0xe;
  local_170[0x1e] = '\0';
  local_170._0_8_ = local_170 + 0x10;
  iVar1 = (*options->_vptr_options_i[1])(options,local_170);
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<multi_oaa,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<multi_oaa,example>::init_learner<LEARNER::learner<char,example>>
                       (dat,base,predict_or_learn<true>,predict_or_learn<false>,dat->k,multilabels);
    *(undefined8 *)(plVar2 + 0x58) = *(undefined8 *)(plVar2 + 0x18);
    *(code **)(plVar2 + 0x68) = finish_example;
    ppuVar4 = &MULTILABEL::multilabel;
    plVar5 = &all->p->lp;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      plVar5->default_label = (_func_void_void_ptr *)*ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      plVar5 = (label_parser *)((long)plVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    all->label_type = multi;
    all->delete_prediction = (_func_void_void_ptr *)PTR_delete_label_002d1a80;
    dat = (multi_oaa *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_name._M_dataplus._M_p != &local_1e8.m_name.field_2) {
    operator_delete(local_1e8.m_name._M_dataplus._M_p);
  }
  if (dat != (multi_oaa *)0x0) {
    free(dat);
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* multilabel_oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<multi_oaa>();
  option_group_definition new_options("Multilabel One Against All");
  new_options.add(make_option("multilabel_oaa", data->k).keep().help("One-against-all multilabel with <k> labels"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multilabel_oaa"))
    return nullptr;

  LEARNER::learner<multi_oaa, example>& l = LEARNER::init_learner(data, as_singleline(setup_base(options, all)),
      predict_or_learn<true>, predict_or_learn<false>, data->k, prediction_type::multilabels);
  l.set_finish_example(finish_example);
  all.p->lp = MULTILABEL::multilabel;
  all.label_type = label_type::multi;
  all.delete_prediction = MULTILABEL::multilabel.delete_label;

  return make_base(l);
}